

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Threshold
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t threshold)

{
  uchar uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  byte *pbVar5;
  uchar *puVar6;
  uchar *puVar7;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar9;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff38;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  byte *local_a8;
  uint32_t in_stack_ffffffffffffff60;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint32_t *in_stack_ffffffffffffff80;
  
  uVar8 = in_stack_00000008;
  iVar9 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff50,(uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff60,
             (uint32_t)in_stack_ffffffffffffff68);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff24,iVar9),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff1c,uVar8));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff24,iVar9),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff1c,uVar8));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x13e6cc);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff24,iVar9),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff1c,uVar8));
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x13e71b);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  pbVar5 = puVar4 + (ulong)in_ESI + (ulong)(in_EDX * uVar2);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  puVar4 = puVar4 + (ulong)in_R8D + (ulong)(in_R9D * uVar3);
  puVar6 = puVar4 + in_stack_00000010 * uVar3;
  for (; puVar4 != puVar6; puVar4 = puVar4 + uVar3) {
    local_a8 = pbVar5;
    for (puVar7 = puVar4; puVar7 != puVar4 + in_stack_00000008; puVar7 = puVar7 + 1) {
      uVar1 = 0xff;
      if (*local_a8 < in_stack_00000018) {
        uVar1 = '\0';
      }
      *puVar7 = uVar1;
      local_a8 = local_a8 + 1;
    }
    pbVar5 = pbVar5 + uVar2;
  }
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t threshold )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );
        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = (*inX) < threshold ? 0 : 255;
        }
    }